

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  allocator local_79;
  text local_78;
  text local_58;
  string local_38 [32];
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->n);
  poVar1 = std::operator<<(poVar1," selected ");
  std::__cxx11::string::string(local_38,"test",&local_79);
  std::__cxx11::string::string((string *)&local_78,local_38);
  pluralise(&local_58,&local_78,this->n);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }